

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::resizeColumnToContents(QTreeView *this,int column)

{
  bool bVar1;
  int iVar2;
  QTreeViewPrivate *pQVar3;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QHeaderView *in_stack_00000018;
  QTreeViewPrivate *d;
  int header;
  int contents;
  int in_stack_00000058;
  int in_stack_0000005c;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int logicalIndex;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QTreeView *)0x8ef30e);
  logicalIndex = (int)((ulong)pQVar3 >> 0x20);
  QAbstractItemViewPrivate::executePostedLayout
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if ((-1 < in_ESI) &&
     (iVar4 = in_ESI,
     iVar2 = QHeaderView::count((QHeaderView *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
     in_ESI < iVar2)) {
    local_c = (**(code **)(*in_RDI + 0x200))(in_RDI,iVar4);
    bVar1 = QWidget::isHidden((QWidget *)0x8ef373);
    if (bVar1) {
      local_38 = 0;
    }
    else {
      local_38 = QHeaderView::sectionSizeHint
                           ((QHeaderView *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),logicalIndex);
    }
    local_10 = local_38;
    qMax<int>(&local_c,&local_10);
    QHeaderView::resizeSection(in_stack_00000018,in_stack_0000005c,in_stack_00000058);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::resizeColumnToContents(int column)
{
    Q_D(QTreeView);
    d->executePostedLayout();
    if (column < 0 || column >= d->header->count())
        return;
    int contents = sizeHintForColumn(column);
    int header = d->header->isHidden() ? 0 : d->header->sectionSizeHint(column);
    d->header->resizeSection(column, qMax(contents, header));
}